

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  int *piVar1;
  ImTextureID *ppvVar2;
  uint *puVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  int iVar6;
  ImGuiViewportP *pIVar7;
  ImDrawList *this;
  ImDrawCmd *pIVar8;
  ImDrawCmd *pIVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImDrawCmd local_58;
  
  if (0xffffff < col) {
    pIVar7 = *(GImGui->Viewports).Data;
    IVar4 = (pIVar7->super_ImGuiViewport).Pos;
    IVar5 = (pIVar7->super_ImGuiViewport).Size;
    fVar11 = IVar5.x + IVar4.x;
    fVar12 = IVar5.y + IVar4.y;
    local_68._8_4_ = fVar11;
    local_68._0_4_ = IVar4.x;
    local_68._4_4_ = IVar4.y;
    local_68._12_4_ = fVar12;
    this = window->RootWindow->DrawList;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    local_58.ClipRect.y = IVar4.y + -1.0;
    local_58.ClipRect.x = IVar4.x + -1.0;
    local_70.y = fVar12 + 1.0;
    local_70.x = fVar11 + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_58,&local_70,false);
    ImDrawList::AddRectFilled(this,(ImVec2 *)local_68,(ImVec2 *)(local_68 + 8),col,0.0,0);
    pIVar9 = (this->CmdBuffer).Data;
    iVar6 = (this->CmdBuffer).Size;
    local_58.UserCallbackData = pIVar9[(long)iVar6 + -1].UserCallbackData;
    pIVar8 = pIVar9 + (long)iVar6 + -1;
    local_58.ClipRect.x = (pIVar8->ClipRect).x;
    local_58.ClipRect.y = (pIVar8->ClipRect).y;
    local_58.ClipRect.z = (pIVar8->ClipRect).z;
    local_58.ClipRect.w = (pIVar8->ClipRect).w;
    ppvVar2 = &pIVar9[(long)iVar6 + -1].TextureId;
    local_58.TextureId._0_4_ = *(undefined4 *)ppvVar2;
    local_58.TextureId._4_4_ = *(undefined4 *)((long)ppvVar2 + 4);
    local_58.VtxOffset = *(uint *)(ppvVar2 + 1);
    local_58.IdxOffset = *(uint *)((long)ppvVar2 + 0xc);
    puVar3 = &pIVar9[(long)iVar6 + -1].ElemCount;
    local_58.ElemCount = *puVar3;
    local_58._36_4_ = puVar3[1];
    local_58.UserCallback._0_4_ = puVar3[2];
    local_58.UserCallback._4_4_ = puVar3[3];
    (this->CmdBuffer).Size = iVar6 + -1;
    if (iVar6 + -1 == 0) {
      if ((this->CmdBuffer).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar9 = (ImDrawCmd *)(*GImAllocatorAllocFunc)(0x1c0,GImAllocatorUserData);
        pIVar8 = (this->CmdBuffer).Data;
        if (pIVar8 != (ImDrawCmd *)0x0) {
          memcpy(pIVar9,pIVar8,(long)(this->CmdBuffer).Size * 0x38);
          pIVar8 = (this->CmdBuffer).Data;
          if ((pIVar8 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
        }
        (this->CmdBuffer).Data = pIVar9;
        (this->CmdBuffer).Capacity = 8;
        lVar10 = (long)(this->CmdBuffer).Size;
      }
      else {
        lVar10 = 0;
      }
      pIVar9[lVar10].UserCallbackData = local_58.UserCallbackData;
      *(ulong *)&pIVar9[lVar10].ElemCount = CONCAT44(local_58._36_4_,local_58.ElemCount);
      *(ImDrawCallback *)(&pIVar9[lVar10].ElemCount + 2) =
           (ImDrawCallback)CONCAT44(local_58.UserCallback._4_4_,local_58.UserCallback._0_4_);
      pIVar9[lVar10].TextureId =
           (ImTextureID)CONCAT44(local_58.TextureId._4_4_,local_58.TextureId._0_4_);
      (&pIVar9[lVar10].TextureId)[1] = (ImTextureID)CONCAT44(local_58.IdxOffset,local_58.VtxOffset);
      pIVar9 = pIVar9 + lVar10;
      (pIVar9->ClipRect).x = local_58.ClipRect.x;
      (pIVar9->ClipRect).y = local_58.ClipRect.y;
      (pIVar9->ClipRect).z = local_58.ClipRect.z;
      (pIVar9->ClipRect).w = local_58.ClipRect.w;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    }
    else {
      ImVector<ImDrawCmd>::insert(&this->CmdBuffer,pIVar9,&local_58);
    }
    ImDrawList::PopClipRect(this);
    ImDrawList::AddDrawCmd(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }
}